

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_tpdf_free(lysf_ctx *ctx,lysp_tpdf *tpdf)

{
  lysp_ext_instance *local_30;
  lysp_ext_instance *local_20;
  uint64_t c__;
  lysp_tpdf *tpdf_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,tpdf->name);
  lydict_remove(ctx->ctx,tpdf->units);
  lydict_remove(ctx->ctx,(tpdf->dflt).str);
  lydict_remove(ctx->ctx,tpdf->dsc);
  lydict_remove(ctx->ctx,tpdf->ref);
  local_20 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (tpdf->exts == (lysp_ext_instance *)0x0) {
      local_30 = (lysp_ext_instance *)0x0;
    }
    else {
      local_30 = tpdf->exts[-1].exts;
    }
    if (local_30 <= local_20) break;
    lysp_ext_instance_free(ctx,tpdf->exts + (long)local_20);
    local_20 = (lysp_ext_instance *)((long)&local_20->name + 1);
  }
  if (tpdf->exts != (lysp_ext_instance *)0x0) {
    free(&tpdf->exts[-1].exts);
  }
  lysp_type_free(ctx,&tpdf->type);
  return;
}

Assistant:

static void
lysp_tpdf_free(struct lysf_ctx *ctx, struct lysp_tpdf *tpdf)
{
    lydict_remove(ctx->ctx, tpdf->name);
    lydict_remove(ctx->ctx, tpdf->units);
    lydict_remove(ctx->ctx, tpdf->dflt.str);
    lydict_remove(ctx->ctx, tpdf->dsc);
    lydict_remove(ctx->ctx, tpdf->ref);
    FREE_ARRAY(ctx, tpdf->exts, lysp_ext_instance_free);

    lysp_type_free(ctx, &tpdf->type);

}